

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

string * google::protobuf::strings::Substitute
                   (string *__return_storage_ptr__,string *format,SubstituteArg *arg0,
                   SubstituteArg *arg1,SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,
                   SubstituteArg *arg5,SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,
                   SubstituteArg *arg9)

{
  char *format_00;
  SubstituteArg *arg3_local;
  SubstituteArg *arg2_local;
  SubstituteArg *arg1_local;
  SubstituteArg *arg0_local;
  string *format_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  format_00 = (char *)std::__cxx11::string::c_str();
  SubstituteAndAppend(__return_storage_ptr__,format_00,arg0,arg1,arg2,arg3,arg4,arg5,arg6,arg7,arg8,
                      arg9);
  return __return_storage_ptr__;
}

Assistant:

std::string Substitute(const std::string& format, const SubstituteArg& arg0,
                       const SubstituteArg& arg1, const SubstituteArg& arg2,
                       const SubstituteArg& arg3, const SubstituteArg& arg4,
                       const SubstituteArg& arg5, const SubstituteArg& arg6,
                       const SubstituteArg& arg7, const SubstituteArg& arg8,
                       const SubstituteArg& arg9) {
  std::string result;
  SubstituteAndAppend(&result, format.c_str(), arg0, arg1, arg2, arg3, arg4,
                      arg5, arg6, arg7, arg8, arg9);
  return result;
}